

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool wasEscaped(iterator First,iterator Position)

{
  bool bVar1;
  char *local_20;
  iterator I;
  iterator Position_local;
  iterator First_local;
  
  if (First <= Position + -1) {
    local_20 = Position + -1;
    while( true ) {
      bVar1 = false;
      if (First <= local_20) {
        bVar1 = *local_20 == '\\';
      }
      if (!bVar1) break;
      local_20 = local_20 + -1;
    }
    return (long)(Position + (-1 - (long)local_20)) % 2 == 1;
  }
  __assert_fail("Position - 1 >= First",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/YAMLParser.cpp"
                ,0x4b6,"bool wasEscaped(StringRef::iterator, StringRef::iterator)");
}

Assistant:

static bool wasEscaped(StringRef::iterator First,
                       StringRef::iterator Position) {
  assert(Position - 1 >= First);
  StringRef::iterator I = Position - 1;
  // We calculate the number of consecutive '\'s before the current position
  // by iterating backwards through our string.
  while (I >= First && *I == '\\') --I;
  // (Position - 1 - I) now contains the number of '\'s before the current
  // position. If it is odd, the character at 'Position' was escaped.
  return (Position - 1 - I) % 2 == 1;
}